

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

int64_t parse_uint(uint8_t *s,size_t len)

{
  size_t i;
  int64_t n;
  size_t len_local;
  uint8_t *s_local;
  int64_t local_8;
  
  n = 0;
  if (len == 0) {
    local_8 = -1;
  }
  else {
    for (i = 0; i < len; i = i + 1) {
      if ((s[i] < 0x30) || (0x39 < s[i])) {
        return -1;
      }
      if (0xccccccccccccccc < n) {
        return -1;
      }
      if (0x7fffffffffffffff - (long)(int)(s[i] - 0x30) < n * 10) {
        return -1;
      }
      n = (long)(int)(s[i] - 0x30) + n * 10;
    }
    local_8 = n;
  }
  return local_8;
}

Assistant:

static int64_t parse_uint(const uint8_t *s, size_t len) {
  int64_t n = 0;
  size_t i;
  if (len == 0) {
    return -1;
  }
  for (i = 0; i < len; ++i) {
    if ('0' <= s[i] && s[i] <= '9') {
      if (n > INT64_MAX / 10) {
        return -1;
      }
      n *= 10;
      if (n > INT64_MAX - (s[i] - '0')) {
        return -1;
      }
      n += s[i] - '0';
      continue;
    }
    return -1;
  }
  return n;
}